

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

int infile_format(char *fname)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  OPJ_SIZE_T l_nb_read;
  uchar buf [12];
  int magic_format;
  int ext_format;
  char *magic_s;
  char *s;
  FILE *reader;
  char *fname_local;
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    fname_local._4_4_ = -2;
  }
  else {
    memset((void *)((long)&l_nb_read + 4),0,0xc);
    sVar2 = fread((void *)((long)&l_nb_read + 4),1,0xc,__stream);
    fclose(__stream);
    if (sVar2 == 0xc) {
      buf._8_4_ = get_file_format(fname);
      if (buf._8_4_ == 2) {
        fname_local._4_4_ = 2;
      }
      else {
        iVar1 = memcmp((void *)((long)&l_nb_read + 4),"",0xc);
        if ((iVar1 == 0) || (l_nb_read._4_4_ == 0xa870a0d)) {
          buf[4] = '\x01';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          _magic_format = ".jp2 or .jph";
        }
        else {
          if (l_nb_read._4_4_ != 0x51ff4fff) {
            return -1;
          }
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          _magic_format = ".j2k or .jpc or .j2c or .jhc";
        }
        if (buf._4_4_ == buf._8_4_) {
          fname_local._4_1_ = buf[8];
          fname_local._5_1_ = buf[9];
          fname_local._6_1_ = buf[10];
          fname_local._7_1_ = buf[0xb];
        }
        else {
          sVar2 = strlen(fname);
          fputs("\n===========================================\n",_stderr);
          fprintf(_stderr,"The extension of this file is incorrect.\nFOUND %s. SHOULD BE %s\n",
                  fname + (sVar2 - 4),_magic_format);
          fputs("===========================================\n",_stderr);
          fname_local._4_1_ = buf[4];
          fname_local._5_1_ = buf[5];
          fname_local._6_1_ = buf[6];
          fname_local._7_1_ = buf[7];
        }
      }
    }
    else {
      fname_local._4_4_ = -1;
    }
  }
  return fname_local._4_4_;
}

Assistant:

static int infile_format(const char *fname)
{
    FILE *reader;
    const char *s, *magic_s;
    int ext_format, magic_format;
    unsigned char buf[12];
    OPJ_SIZE_T l_nb_read;

    reader = fopen(fname, "rb");

    if (reader == NULL) {
        return -2;
    }

    memset(buf, 0, 12);
    l_nb_read = fread(buf, 1, 12, reader);
    fclose(reader);
    if (l_nb_read != 12) {
        return -1;
    }



    ext_format = get_file_format(fname);

    if (ext_format == JPT_CFMT) {
        return JPT_CFMT;
    }

    if (memcmp(buf, JP2_RFC3745_MAGIC, 12) == 0 || memcmp(buf, JP2_MAGIC, 4) == 0) {
        magic_format = JP2_CFMT;
        magic_s = ".jp2 or .jph";
    } else if (memcmp(buf, J2K_CODESTREAM_MAGIC, 4) == 0) {
        magic_format = J2K_CFMT;
        magic_s = ".j2k or .jpc or .j2c or .jhc";
    } else {
        return -1;
    }

    if (magic_format == ext_format) {
        return ext_format;
    }

    s = fname + strlen(fname) - 4;

    fputs("\n===========================================\n", stderr);
    fprintf(stderr, "The extension of this file is incorrect.\n"
            "FOUND %s. SHOULD BE %s\n", s, magic_s);
    fputs("===========================================\n", stderr);

    return magic_format;
}